

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O3

void __thiscall preprocessor_test_serial_Test::TestBody(preprocessor_test_serial_Test *this)

{
  char *message;
  char serial_id_b [32];
  char serial_id_a [32];
  AssertHelper AStack_68;
  Message local_60;
  internal local_58 [8];
  undefined8 *local_50;
  char local_48 [64];
  
  builtin_strncpy(local_48 + 0x30,"T_SERIAL_TAG186",0x10);
  builtin_strncpy(local_48 + 0x20,"PREPROCESSOR_TES",0x10);
  builtin_strncpy(local_48 + 0x10,"T_SERIAL_TAG188",0x10);
  builtin_strncpy(local_48,"PREPROCESSOR_TES",0x10);
  testing::internal::CmpHelperSTRNE(local_58,"serial_id_a","serial_id_b",local_48 + 0x20,local_48);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message(&local_60);
    if (local_50 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xbe,message);
    testing::internal::AssertHelper::operator=(&AStack_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    if (local_60.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_60.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(local_50);
  }
  return;
}

Assistant:

TEST_F(preprocessor_test, serial)
{
#define PREPROCSSOR_TEST_SERIAL_TAG abc

	const char serial_id_a[] = PREPROCESSOR_STRINGIFY(PREPROCESSOR_SERIAL_ID(PREPROCESSOR_TEST_SERIAL_TAG));

	const char serial_id_b[] = PREPROCESSOR_STRINGIFY(PREPROCESSOR_SERIAL_ID(PREPROCESSOR_TEST_SERIAL_TAG));

	EXPECT_STRNE(serial_id_a, serial_id_b);

#undef PREPROCESSOR_TEST_SERIAL_TAG
}